

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O2

void ConvertRowsToUV(uint16_t *rgb,uint8_t *dst_u,uint8_t *dst_v,int width,VP8Random *rg)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = 0;
  uVar5 = (ulong)(uint)width;
  if (width < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    uVar1 = rgb[uVar6 * 4];
    uVar2 = rgb[uVar6 * 4 + 1];
    uVar3 = rgb[uVar6 * 4 + 2];
    iVar4 = VP8RandomBits(rg,0x12);
    iVar4 = (uint)uVar3 * 0x7080 + iVar4 + (uint)uVar2 * -0x4a89 + (uint)uVar1 * -0x25f7 + 0x2000000
    ;
    if (iVar4 >> 0x12 < 1) {
      iVar4 = 0;
    }
    iVar4 = iVar4 >> 0x12;
    if (0xfe < iVar4) {
      iVar4 = 0xff;
    }
    dst_u[uVar6] = (uint8_t)iVar4;
    iVar4 = VP8RandomBits(rg,0x12);
    iVar4 = (uint)uVar3 * -0x124c + iVar4 + (uint)uVar2 * -0x5e34 + (uint)uVar1 * 0x7080 + 0x2000000
    ;
    if (iVar4 >> 0x12 < 1) {
      iVar4 = 0;
    }
    iVar4 = iVar4 >> 0x12;
    if (0xfe < iVar4) {
      iVar4 = 0xff;
    }
    dst_v[uVar6] = (uint8_t)iVar4;
  }
  return;
}

Assistant:

static WEBP_INLINE void ConvertRowsToUV(const uint16_t* rgb,
                                        uint8_t* const dst_u,
                                        uint8_t* const dst_v,
                                        int width,
                                        VP8Random* const rg) {
  int i;
  for (i = 0; i < width; i += 1, rgb += 4) {
    const int r = rgb[0], g = rgb[1], b = rgb[2];
    dst_u[i] = RGBToU(r, g, b, rg);
    dst_v[i] = RGBToV(r, g, b, rg);
  }
}